

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

double sexp_bignum_to_double(sexp a)

{
  undefined8 uVar1;
  sexp_uint_t sVar2;
  sexp in_RDI;
  undefined1 auVar3 [16];
  sexp_uint_t *data;
  sexp_sint_t i;
  double res;
  sexp_uint_t local_18;
  double local_10;
  
  local_10 = 0.0;
  sVar2 = sexp_bignum_hi(in_RDI);
  while (local_18 = sVar2 - 1, -1 < (long)local_18) {
    uVar1 = *(undefined8 *)((long)&in_RDI->value + sVar2 * 8 + 8);
    auVar3._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar3._0_8_ = uVar1;
    auVar3._12_4_ = 0x45300000;
    local_10 = local_10 * 1.8446744073709552e+19 +
               (auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    sVar2 = local_18;
  }
  return local_10 * (double)(int)(in_RDI->value).flonum_bits[0];
}

Assistant:

double sexp_bignum_to_double (sexp a) {
  double res = 0;
  sexp_sint_t i;
  sexp_uint_t *data=sexp_bignum_data(a);
  for (i=sexp_bignum_hi(a)-1; i>=0; i--)
    res = res * ((double)SEXP_UINT_T_MAX+1) + data[i];
  return res * sexp_bignum_sign(a);
}